

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O0

void __thiscall RoughConductorBRDF::RoughConductorBRDF(RoughConductorBRDF *this,Json *conf)

{
  undefined1 auVar1 [16];
  undefined1 uVar2;
  __type _Var3;
  bool bVar4;
  undefined8 *puVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3f vVar7;
  int i;
  bool found;
  string name;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  char (*local_1f8) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  Json *local_1c8;
  undefined7 in_stack_fffffffffffffe78;
  int local_b0;
  string local_a8 [119];
  allocator local_31;
  string local_30 [48];
  
  BxDF::BxDF((BxDF *)&in_RDI[2].m_value);
  BRDF::BRDF((BRDF *)in_RDI,&PTR_construction_vtable_24__001e8b40);
  *(undefined8 *)in_RDI = 0x1e8af8;
  in_RDI[2].m_value.object = (object_t *)(vtable + 0x48);
  vec3f::vec3f((vec3f *)&in_RDI->m_value);
  vec3f::vec3f((vec3f *)&in_RDI[1].field_0x4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Cu",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[9]>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)in_stack_fffffffffffffe18,local_1f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffdf8);
  uVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdf8);
  if ((bool)uVar2) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffdf8);
    std::__cxx11::string::operator=(local_30,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
  fVar6 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_float<float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)0x193c92);
  *(float *)(in_RDI + 2) = fVar6;
  bVar4 = false;
  for (local_b0 = 0; local_b0 < 0x28; local_b0 = local_b0 + 1) {
    _Var3 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if (_Var3) {
      bVar4 = true;
      in_RDI->m_value = *(json_value *)&complexIorList[local_b0].eta;
      *(float *)(in_RDI + 1) = complexIorList[local_b0].eta.z;
      *(undefined8 *)&in_RDI[1].field_0x4 = *(undefined8 *)&complexIorList[local_b0].k;
      *(float *)((long)&in_RDI[1].m_value + 4) = complexIorList[local_b0].k.z;
    }
  }
  if (bVar4) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[4]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffe18,(char (*) [4])local_1f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffdf8);
    bVar4 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         in_stack_fffffffffffffdf8);
    if (bVar4) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
      vVar7 = json2vec3f(local_1c8);
      auVar1._8_4_ = extraout_XMM0_Dc;
      auVar1._0_8_ = vVar7._0_8_;
      auVar1._12_4_ = extraout_XMM0_Dd;
      local_1c8 = auVar1._8_8_;
      (in_RDI->m_value).number_integer = vVar7._0_8_;
      *(float *)(in_RDI + 1) = vVar7.z;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[2]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffe18,(char (*) [2])local_1f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffdf8);
    bVar4 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         in_stack_fffffffffffffdf8);
    if (bVar4) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_RDI,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
      vVar7 = json2vec3f(local_1c8);
      *(long *)&in_RDI[1].field_0x4 = vVar7._0_8_;
      *(float *)((long)&in_RDI[1].m_value + 4) = vVar7.z;
    }
    std::__cxx11::string::~string(local_30);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "conductor material not found";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

RoughConductorBRDF(const Json& conf)
	{
		std::string name = "Cu";
		if (conf.find("material") != conf.end())
			name = conf["material"];
		alpha = conf["roughness"];
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
		if (conf.find("eta") != conf.end())
			eta = json2vec3f(conf["eta"]);
		if (conf.find("k") != conf.end())
			k = json2vec3f(conf["k"]);
	}